

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

EC_GROUP * anon_unknown.dwarf_5c29f0::GetCurve(FileTest *t,char *key)

{
  bool bVar1;
  int iVar2;
  EC_GROUP *pEVar3;
  string curve_name;
  string local_60;
  string local_40;
  
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Curve","");
  bVar1 = FileTest::GetAttribute(t,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&local_60);
    if (iVar2 == 0) {
      pEVar3 = EC_group_p224();
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_60);
      if (iVar2 == 0) {
        pEVar3 = EC_group_p256();
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_60);
        if (iVar2 == 0) {
          pEVar3 = EC_group_p384();
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_60);
          if (iVar2 == 0) {
            pEVar3 = EC_group_p521();
          }
          else {
            pEVar3 = (EC_GROUP *)0x0;
            FileTest::PrintLine(t,"Unknown curve \'%s\'",local_60._M_dataplus._M_p);
          }
        }
      }
    }
  }
  else {
    pEVar3 = (EC_GROUP *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return pEVar3;
}

Assistant:

static const EC_GROUP *GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return EC_group_p224();
  }
  if (curve_name == "P-256") {
    return EC_group_p256();
  }
  if (curve_name == "P-384") {
    return EC_group_p384();
  }
  if (curve_name == "P-521") {
    return EC_group_p521();
  }

  t->PrintLine("Unknown curve '%s'", curve_name.c_str());
  return nullptr;
}